

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

string * __thiscall CppGenerator::genHeader_abi_cxx11_(CppGenerator *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string s;
  string *header;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string local_328 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  CppGenerator *in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  char *in_stack_fffffffffffffd08;
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [35];
  undefined1 local_45;
  allocator local_31;
  string local_30 [48];
  
  __rhs = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"DATAHANDLER",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_45 = 0;
  std::operator+(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::~string(local_188);
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::string::~string(local_1c8);
  offset_abi_cxx11_(in_stack_fffffffffffffcf8,(size_t)in_stack_fffffffffffffcf0);
  std::operator+((char *)in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_fffffffffffffcf8,(size_t)in_stack_fffffffffffffcf0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::__cxx11::string::operator+=((string *)in_RDI,local_1e8);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string(local_228);
  std::__cxx11::string::~string(local_248);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string(local_268);
  std::__cxx11::string::~string(local_288);
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::~string(local_2c8);
  std::__cxx11::string::~string(local_2e8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffcf8);
  local_45 = 1;
  std::__cxx11::string::~string(local_30);
  return __rhs;
}

Assistant:

std::string CppGenerator::genHeader()
{   
    std::string s = "DATAHANDLER";
    std::string header = "#ifndef INCLUDE_"+s+"_HPP_\n"+
        "#define INCLUDE_"+s+"_HPP_\n\n"+
        "#include <algorithm>\n"+
        "#include <chrono>\n"+
        "#include <cstring>\n"+
        "#include <fstream>\n"+
        "#include <iostream>\n" +
        "#include <thread>\n" +
        "#include <unordered_map>\n" +
        "#include <vector>\n\n";

#if defined(__GNUC__) && defined(NDEBUG) && !defined(__clang__)
   header += "#include <parallel/algorithm>\n";
#endif
    
   header += "using namespace std::chrono;\n\nnamespace lmfao\n{\n"+
        offset(1)+"//const std::string PATH_TO_DATA = \"/Users/Maximilian/Documents/"+
        "Oxford/LMFAO/"+PATH_TO_DATA+"\";\n"+
        offset(1)+"const std::string PATH_TO_DATA = \"../../"+PATH_TO_DATA+"\";\n\n";

   return header;
}